

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagate.cpp
# Opt level: O0

bool __thiscall CaDiCaL::Internal::propagate(Internal *this)

{
  int iVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  Clause *reason;
  Var *pVVar5;
  reference pWVar6;
  reference pvVar7;
  Profile *in_RSI;
  Profile *profile;
  Internal *in_RDI;
  double s_00;
  double s_01;
  int s;
  int pos;
  int other_level;
  char v;
  int r;
  literal_iterator k;
  const_literal_iterator end;
  literal_iterator middle;
  int size;
  char u;
  int other;
  literal_iterator lits;
  char b;
  Watch w;
  const_watch_iterator i;
  watch_iterator j;
  const_watch_iterator eow;
  Watches *ws;
  int lit;
  int64_t before;
  undefined4 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  Internal *in_stack_fffffffffffffec0;
  Internal *pIVar8;
  __normal_iterator<const_CaDiCaL::Watch_*,_std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>
  *in_stack_fffffffffffffec8;
  Profile *profile_00;
  Clause *in_stack_fffffffffffffed0;
  reference in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffee0;
  uint in_stack_fffffffffffffee4;
  uint in_stack_fffffffffffffeec;
  size_type in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 uVar9;
  __normal_iterator<CaDiCaL::Watch_*,_std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>
  local_d8;
  __normal_iterator<const_CaDiCaL::Watch_*,_std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>
  local_d0;
  Watch *local_c8;
  uint local_bc;
  int local_b8;
  int local_b4;
  Watch *local_b0;
  char local_a5;
  uint local_a4;
  uint *local_a0;
  uint *local_98;
  uint *local_90;
  int local_84;
  char local_7d;
  uint local_7c;
  uint *local_78;
  Watch *local_70;
  char local_61;
  __normal_iterator<CaDiCaL::Watch_*,_std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>
  local_60;
  __normal_iterator<const_CaDiCaL::Watch_*,_std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>
  local_58;
  Watch local_50;
  undefined1 local_40 [44];
  uint local_14;
  size_t local_10;
  
  if (in_RDI->level != 0) {
    in_RSI = (Profile *)0x100;
    require_mode(in_RDI,SEARCH);
  }
  profile = in_RSI;
  if ((in_RDI->internal->profiles).propagate.level <= (in_RDI->internal->opts).profile) {
    pIVar8 = in_RDI->internal;
    profile = &(in_RDI->internal->profiles).propagate;
    time(in_RDI->internal,(time_t *)in_RSI);
    start_profiling(pIVar8,profile,s_00);
  }
  local_10 = in_RDI->propagated;
  do {
    uVar9 = false;
    if (in_RDI->conflict == (Clause *)0x0) {
      in_stack_fffffffffffffef8 = in_RDI->propagated;
      sVar3 = std::vector<int,_std::allocator<int>_>::size(&in_RDI->trail);
      uVar9 = in_stack_fffffffffffffef8 != sVar3;
    }
    if ((bool)uVar9 == false) {
      if ((in_RDI->searching_lucky_phases & 1U) == 0) {
        (in_RDI->stats).propagations.search =
             (in_RDI->propagated - local_10) + (in_RDI->stats).propagations.search;
        if (in_RDI->conflict == (Clause *)0x0) {
          in_RDI->no_conflict_until = in_RDI->propagated;
        }
        else {
          if ((in_RDI->stable & 1U) != 0) {
            (in_RDI->stats).stabconflicts = (in_RDI->stats).stabconflicts + 1;
          }
          (in_RDI->stats).conflicts = (in_RDI->stats).conflicts + 1;
          profile = (Profile *)(long)in_RDI->level;
          pvVar7 = std::vector<CaDiCaL::Level,_std::allocator<CaDiCaL::Level>_>::operator[]
                             (&in_RDI->control,(size_type)profile);
          in_RDI->no_conflict_until = (long)pvVar7->trail;
        }
      }
      if ((in_RDI->internal->profiles).propagate.level <= (in_RDI->internal->opts).profile) {
        pIVar8 = in_RDI->internal;
        profile_00 = &(in_RDI->internal->profiles).propagate;
        time(in_RDI->internal,(time_t *)profile);
        stop_profiling(pIVar8,profile_00,s_01);
      }
      return (bool)((in_RDI->conflict != (Clause *)0x0 ^ 0xffU) & 1);
    }
    sVar3 = in_RDI->propagated;
    in_RDI->propagated = sVar3 + 1;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->trail,sVar3);
    local_14 = -*pvVar4;
    local_40._32_8_ = watches(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
    local_40._16_8_ =
         std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>::end
                   ((vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_> *)
                    CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    __gnu_cxx::
    __normal_iterator<CaDiCaL::Watch_const*,std::vector<CaDiCaL::Watch,std::allocator<CaDiCaL::Watch>>>
    ::__normal_iterator<CaDiCaL::Watch*>
              ((__normal_iterator<const_CaDiCaL::Watch_*,_std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>
                *)in_stack_fffffffffffffec0,
               (__normal_iterator<CaDiCaL::Watch_*,_std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>
                *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    local_40._8_8_ =
         std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>::begin
                   ((vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_> *)
                    CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    __gnu_cxx::
    __normal_iterator<CaDiCaL::Watch_const*,std::vector<CaDiCaL::Watch,std::allocator<CaDiCaL::Watch>>>
    ::__normal_iterator<CaDiCaL::Watch*>
              ((__normal_iterator<const_CaDiCaL::Watch_*,_std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>
                *)in_stack_fffffffffffffec0,
               (__normal_iterator<CaDiCaL::Watch_*,_std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>
                *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_CaDiCaL::Watch_*,_std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>
                               *)in_stack_fffffffffffffec0,
                              (__normal_iterator<const_CaDiCaL::Watch_*,_std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>
                               *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)),
          bVar2) {
      local_58 = __gnu_cxx::
                 __normal_iterator<const_CaDiCaL::Watch_*,_std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>
                 ::operator++(in_stack_fffffffffffffec8,
                              (int)((ulong)in_stack_fffffffffffffec0 >> 0x20));
      reason = (Clause *)
               __gnu_cxx::
               __normal_iterator<const_CaDiCaL::Watch_*,_std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>
               ::operator*(&local_58);
      local_60 = __gnu_cxx::
                 __normal_iterator<CaDiCaL::Watch_*,_std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>
                 ::operator++((__normal_iterator<CaDiCaL::Watch_*,_std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>
                               *)in_stack_fffffffffffffec8,
                              (int)((ulong)in_stack_fffffffffffffec0 >> 0x20));
      pWVar6 = __gnu_cxx::
               __normal_iterator<CaDiCaL::Watch_*,_std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>
               ::operator*(&local_60);
      pWVar6->clause = (Clause *)reason->field_0;
      *(undefined8 *)&pWVar6->blit = *(undefined8 *)&reason->field_0x8;
      local_50.clause = pWVar6->clause;
      local_50.blit = pWVar6->blit;
      local_50.size = pWVar6->size;
      local_61 = val(in_RDI,local_50.blit);
      if (local_61 < '\x01') {
        bVar2 = Watch::binary(&local_50);
        if (bVar2) {
          if (local_61 < '\0') {
            in_RDI->conflict = local_50.clause;
          }
          else {
            build_chain_for_units
                      ((Internal *)CONCAT17(uVar9,in_stack_ffffffffffffff00),
                       (int)(in_stack_fffffffffffffef8 >> 0x20),reason,
                       SUB41(in_stack_fffffffffffffeec >> 0x18,0));
            search_assign((Internal *)CONCAT17(uVar9,in_stack_ffffffffffffff00),
                          (int)(in_stack_fffffffffffffef8 >> 0x20),reason);
          }
        }
        else {
          if (in_RDI->conflict != (Clause *)0x0) break;
          if ((*(uint *)&(local_50.clause)->field_0x8 >> 4 & 1) == 0) {
            local_78 = (uint *)Clause::begin(local_50.clause);
            local_7c = *local_78 ^ local_78[1] ^ local_14;
            local_7d = val(in_RDI,local_7c);
            if (local_7d < '\x01') {
              local_84 = (local_50.clause)->size;
              local_a0 = local_78 + (local_50.clause)->pos;
              local_98 = local_78 + local_84;
              local_a4 = 0;
              local_a5 = -1;
              local_90 = local_a0;
              while( true ) {
                bVar2 = false;
                if (local_a0 != local_98) {
                  local_a4 = *local_a0;
                  local_a5 = val(in_RDI,local_a4);
                  bVar2 = local_a5 < '\0';
                }
                if (!bVar2) break;
                local_a0 = local_a0 + 1;
              }
              if (local_a5 < '\0') {
                local_a0 = local_78 + 2;
                while( true ) {
                  bVar2 = false;
                  if (local_a0 != local_90) {
                    local_a4 = *local_a0;
                    local_a5 = val(in_RDI,local_a4);
                    bVar2 = local_a5 < '\0';
                  }
                  if (!bVar2) break;
                  local_a0 = local_a0 + 1;
                }
              }
              (local_50.clause)->pos = (int)((long)local_a0 - (long)local_78 >> 2);
              if (local_a5 < '\x01') {
                if (local_a5 == '\0') {
                  *local_78 = local_7c;
                  local_78[1] = local_a4;
                  *local_a0 = local_14;
                  watch_literal((Internal *)
                                CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                                (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                                (int)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
                  local_b0 = (Watch *)__gnu_cxx::
                                      __normal_iterator<CaDiCaL::Watch_*,_std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>
                                      ::operator--((
                                                  __normal_iterator<CaDiCaL::Watch_*,_std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>
                                                  *)in_stack_fffffffffffffec8,
                                                  (int)((ulong)in_stack_fffffffffffffec0 >> 0x20));
                }
                else {
                  if (local_7d != '\0') {
                    in_RDI->conflict = local_50.clause;
                    break;
                  }
                  build_chain_for_units
                            ((Internal *)CONCAT17(uVar9,in_stack_ffffffffffffff00),
                             (int)(in_stack_fffffffffffffef8 >> 0x20),reason,
                             SUB41(in_stack_fffffffffffffeec >> 0x18,0));
                  search_assign((Internal *)CONCAT17(uVar9,in_stack_ffffffffffffff00),
                                (int)(in_stack_fffffffffffffef8 >> 0x20),reason);
                  if (1 < (in_RDI->opts).chrono) {
                    pVVar5 = var(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
                    in_stack_fffffffffffffee0 = pVVar5->level;
                    local_b4 = in_stack_fffffffffffffee0;
                    pVVar5 = var(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
                    if (pVVar5->level < in_stack_fffffffffffffee0) {
                      local_bc = 0;
                      for (local_b8 = 2; local_b8 < local_84; local_b8 = local_b8 + 1) {
                        local_bc = local_78[local_b8];
                        pVVar5 = var(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
                        if (pVVar5->level == local_b4) break;
                      }
                      local_78[local_b8] = local_14;
                      *local_78 = local_7c;
                      local_78[1] = local_bc;
                      watch_literal((Internal *)
                                    CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                                    (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                                    (int)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
                      local_c8 = (Watch *)__gnu_cxx::
                                          __normal_iterator<CaDiCaL::Watch_*,_std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>
                                          ::operator--((
                                                  __normal_iterator<CaDiCaL::Watch_*,_std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>
                                                  *)in_stack_fffffffffffffec8,
                                                  (int)((ulong)in_stack_fffffffffffffec0 >> 0x20));
                    }
                  }
                }
              }
              else {
                in_stack_fffffffffffffee4 = local_a4;
                pWVar6 = __gnu_cxx::
                         __normal_iterator<CaDiCaL::Watch_*,_std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>
                         ::operator[]((__normal_iterator<CaDiCaL::Watch_*,_std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>
                                       *)(local_40 + 8),-1);
                pWVar6->blit = in_stack_fffffffffffffee4;
              }
            }
            else {
              in_stack_fffffffffffffeec = local_7c;
              pWVar6 = __gnu_cxx::
                       __normal_iterator<CaDiCaL::Watch_*,_std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>
                       ::operator[]((__normal_iterator<CaDiCaL::Watch_*,_std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>
                                     *)(local_40 + 8),-1);
              pWVar6->blit = in_stack_fffffffffffffeec;
            }
          }
          else {
            local_70 = (Watch *)__gnu_cxx::
                                __normal_iterator<CaDiCaL::Watch_*,_std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>
                                ::operator--((__normal_iterator<CaDiCaL::Watch_*,_std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>
                                              *)in_stack_fffffffffffffec8,
                                             (int)((ulong)in_stack_fffffffffffffec0 >> 0x20));
          }
        }
      }
    }
    profile = (Profile *)local_40;
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<CaDiCaL::Watch_*,_std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>
                        *)in_stack_fffffffffffffec0,
                       (__normal_iterator<const_CaDiCaL::Watch_*,_std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>
                        *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    if (bVar2) {
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_CaDiCaL::Watch_*,_std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>
                                 *)in_stack_fffffffffffffec0,
                                (__normal_iterator<const_CaDiCaL::Watch_*,_std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)),
            bVar2) {
        local_d0 = __gnu_cxx::
                   __normal_iterator<const_CaDiCaL::Watch_*,_std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>
                   ::operator++(in_stack_fffffffffffffec8,
                                (int)((ulong)in_stack_fffffffffffffec0 >> 0x20));
        in_stack_fffffffffffffed8 =
             __gnu_cxx::
             __normal_iterator<const_CaDiCaL::Watch_*,_std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>
             ::operator*(&local_d0);
        local_d8 = __gnu_cxx::
                   __normal_iterator<CaDiCaL::Watch_*,_std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>
                   ::operator++((__normal_iterator<CaDiCaL::Watch_*,_std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>
                                 *)in_stack_fffffffffffffec8,
                                (int)((ulong)in_stack_fffffffffffffec0 >> 0x20));
        pWVar6 = __gnu_cxx::
                 __normal_iterator<CaDiCaL::Watch_*,_std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>
                 ::operator*(&local_d8);
        pWVar6->clause = in_stack_fffffffffffffed8->clause;
        iVar1 = in_stack_fffffffffffffed8->size;
        pWVar6->blit = in_stack_fffffffffffffed8->blit;
        pWVar6->size = iVar1;
      }
      in_stack_fffffffffffffed0 = (Clause *)local_40._32_8_;
      std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>::begin
                ((vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_> *)
                 CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      profile = (Profile *)
                __gnu_cxx::operator-
                          ((__normal_iterator<CaDiCaL::Watch_*,_std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>
                            *)in_stack_fffffffffffffec0,
                           (__normal_iterator<CaDiCaL::Watch_*,_std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>
                            *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>::resize
                ((vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_> *)
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 (size_type)in_stack_fffffffffffffed8);
    }
  } while( true );
}

Assistant:

bool Internal::propagate () {

  if (level)
    require_mode (SEARCH);
  assert (!unsat);

  START (propagate);

  // Updating statistics counter in the propagation loops is costly so we
  // delay until propagation ran to completion.
  //
  int64_t before = propagated;

  while (!conflict && propagated != trail.size ()) {

    const int lit = -trail[propagated++];
    LOG ("propagating %d", -lit);
    Watches &ws = watches (lit);

    const const_watch_iterator eow = ws.end ();
    watch_iterator j = ws.begin ();
    const_watch_iterator i = j;

    while (i != eow) {

      const Watch w = *j++ = *i++;
      const signed char b = val (w.blit);

      if (b > 0)
        continue; // blocking literal satisfied

      if (w.binary ()) {

        // assert (w.clause->redundant || !w.clause->garbage);

        // In principle we can ignore garbage binary clauses too, but that
        // would require to dereference the clause pointer all the time with
        //
        // if (w.clause->garbage) { j--; continue; } // (*)
        //
        // This is too costly.  It is however necessary to produce correct
        // proof traces if binary clauses are traced to be deleted ('d ...'
        // line) immediately as soon they are marked as garbage.  Actually
        // finding instances where this happens is pretty difficult (six
        // parallel fuzzing jobs in parallel took an hour), but it does
        // occur.  Our strategy to avoid generating incorrect proofs now is
        // to delay tracing the deletion of binary clauses marked as garbage
        // until they are really deleted from memory.  For large clauses
        // this is not necessary since we have to access the clause anyhow.
        //
        // Thanks go to Mathias Fleury, who wanted me to explain why the
        // line '(*)' above was in the code. Removing it actually really
        // improved running times and thus I tried to find concrete
        // instances where this happens (which I found), and then
        // implemented the described fix.

        // Binary clauses are treated separately since they do not require
        // to access the clause at all (only during conflict analysis, and
        // there also only to simplify the code).

        if (b < 0)
          conflict = w.clause; // but continue ...
        else {
          build_chain_for_units (w.blit, w.clause, 0);
          search_assign (w.blit, w.clause);
          // lrat_chain.clear (); done in search_assign
        }

      } else {
        assert (w.clause->size > 2);

        if (conflict)
          break; // Stop if there was a binary conflict already.

        // The cache line with the clause data is forced to be loaded here
        // and thus this first memory access below is the real hot-spot of
        // the solver.  Note, that this check is positive very rarely and
        // thus branch prediction should be almost perfect here.

        if (w.clause->garbage) {
          j--;
          continue;
        }

        literal_iterator lits = w.clause->begin ();

        // Simplify code by forcing 'lit' to be the second literal in the
        // clause.  This goes back to MiniSAT.  We use a branch-less version
        // for conditionally swapping the first two literals, since it
        // turned out to be substantially faster than this one
        //
        //  if (lits[0] == lit) swap (lits[0], lits[1]);
        //
        // which achieves the same effect, but needs a branch.
        //
        const int other = lits[0] ^ lits[1] ^ lit;
        const signed char u = val (other); // value of the other watch

        if (u > 0)
          j[-1].blit = other; // satisfied, just replace blit
        else {

          // This follows Ian Gent's (JAIR'13) idea of saving the position
          // of the last watch replacement.  In essence it needs two copies
          // of the default search for a watch replacement (in essence the
          // code in the 'if (v < 0) { ... }' block below), one starting at
          // the saved position until the end of the clause and then if that
          // one failed to find a replacement another one starting at the
          // first non-watched literal until the saved position.

          const int size = w.clause->size;
          const literal_iterator middle = lits + w.clause->pos;
          const const_literal_iterator end = lits + size;
          literal_iterator k = middle;

          // Find replacement watch 'r' at position 'k' with value 'v'.

          int r = 0;
          signed char v = -1;

          while (k != end && (v = val (r = *k)) < 0)
            k++;

          if (v < 0) { // need second search starting at the head?

            k = lits + 2;
            assert (w.clause->pos <= size);
            while (k != middle && (v = val (r = *k)) < 0)
              k++;
          }

          w.clause->pos = k - lits; // always save position

          assert (lits + 2 <= k), assert (k <= w.clause->end ());

          if (v > 0) {

            // Replacement satisfied, so just replace 'blit'.

            j[-1].blit = r;

          } else if (!v) {

            // Found new unassigned replacement literal to be watched.

            LOG (w.clause, "unwatch %d in", lit);

            lits[0] = other;
            lits[1] = r;
            *k = lit;

            watch_literal (r, lit, w.clause);

            j--; // Drop this watch from the watch list of 'lit'.

          } else if (!u) {

            assert (v < 0);

            // The other watch is unassigned ('!u') and all other literals
            // assigned to false (still 'v < 0'), thus we found a unit.
            //
            build_chain_for_units (other, w.clause, 0);
            search_assign (other, w.clause);
            // lrat_chain.clear (); done in search_assign

            // Similar code is in the implementation of the SAT'18 paper on
            // chronological backtracking but in our experience, this code
            // first does not really seem to be necessary for correctness,
            // and further does not improve running time either.
            //
            if (opts.chrono > 1) {

              const int other_level = var (other).level;

              if (other_level > var (lit).level) {

                // The assignment level of the new unit 'other' is larger
                // than the assignment level of 'lit'.  Thus we should find
                // another literal in the clause at that higher assignment
                // level and watch that instead of 'lit'.

                assert (size > 2);

                int pos, s = 0;

                for (pos = 2; pos < size; pos++)
                  if (var (s = lits[pos]).level == other_level)
                    break;

                assert (s);
                assert (pos < size);

                LOG (w.clause, "unwatch %d in", lit);
                lits[pos] = lit;
                lits[0] = other;
                lits[1] = s;
                watch_literal (s, other, w.clause);

                j--; // Drop this watch from the watch list of 'lit'.
              }
            }
          } else {

            assert (u < 0);
            assert (v < 0);

            // The other watch is assigned false ('u < 0') and all other
            // literals as well (still 'v < 0'), thus we found a conflict.

            conflict = w.clause;
            break;
          }
        }
      }
    }

    if (j != i) {

      while (i != eow)
        *j++ = *i++;

      ws.resize (j - ws.begin ());
    }
  }

  if (searching_lucky_phases) {

    if (conflict)
      LOG (conflict, "ignoring lucky conflict");

  } else {

    // Avoid updating stats eagerly in the hot-spot of the solver.
    //
    stats.propagations.search += propagated - before;

    if (!conflict)
      no_conflict_until = propagated;
    else {

      if (stable)
        stats.stabconflicts++;
      stats.conflicts++;

      LOG (conflict, "conflict");

      // The trail before the current decision level was conflict free.
      //
      no_conflict_until = control[level].trail;
    }
  }

  STOP (propagate);

  return !conflict;
}